

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::exceptions::missing_argument::~missing_argument(missing_argument *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_parsing).super_exception = &PTR__exception_0025e2f8;
  pcVar2 = (this->super_parsing).super_exception.m_message._M_dataplus._M_p;
  paVar1 = &(this->super_parsing).super_exception.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit missing_argument(const std::string& option)
  : parsing(
      "Option " + LQUOTE + option + RQUOTE + " is missing an argument"
    )
  {
  }